

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O0

void __thiscall Encode::encodeFano(Encode *this)

{
  size_type sVar1;
  Encode *this_local;
  
  calcProbabilities(this);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->m_probabilities);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->m_matrix,sVar1);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->m_probabilities);
  quickSortProbability(this,0,(int)sVar1 + -1);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->m_probabilities);
  algorithmFano(this,0,(int)sVar1 + -1);
  output(this);
  return;
}

Assistant:

void encodeFano() {
        calcProbabilities();
        m_matrix.resize(m_probabilities.size());
        quickSortProbability(0, (int) m_probabilities.size() - 1);
        algorithmFano(0, (int) m_probabilities.size() - 1);
        output();
    }